

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_save_indentation(Parser *this,size_t behind)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  ulong in_RSI;
  long in_RDI;
  char msg_1 [42];
  char msg [90];
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  Location *in_stack_fffffffffffffeb0;
  undefined1 local_f8 [64];
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  undefined1 local_98 [104];
  ulong local_30;
  long *local_20;
  long *local_18;
  ulong *local_10;
  ulong *local_8;
  
  local_8 = (ulong *)(*(long *)(in_RDI + 0x9f0) + 0x78);
  local_10 = (ulong *)(*(long *)(in_RDI + 0x9f0) + 0x58);
  local_30 = in_RSI;
  if (*local_8 < *local_10) {
    memcpy(local_98,
           "check failed: (m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin())"
           ,0x5a);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    (*pcVar1)(local_98,0x5a,*(undefined8 *)(in_RDI + 0x9d0));
    in_stack_fffffffffffffe90 = uStack_b8;
    in_stack_fffffffffffffe94 = uStack_b4;
    in_stack_fffffffffffffe98 = local_b0;
    in_stack_fffffffffffffe9c = uStack_ac;
    in_stack_fffffffffffffea0 = uStack_a8;
    in_stack_fffffffffffffea4 = uStack_a4;
    in_stack_fffffffffffffea8 = local_a0;
  }
  local_18 = (long *)(*(long *)(in_RDI + 0x9f0) + 0x78);
  local_20 = (long *)(*(long *)(in_RDI + 0x9f0) + 0x58);
  *(long *)(*(long *)(in_RDI + 0x9f0) + 0x90) = *local_18 - *local_20;
  if (*(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x90) < local_30) {
    memcpy(local_f8,"check failed: (behind <= m_state->indref)",0x2a);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x9e8);
    Location::Location(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                       CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                       CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                       CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    (*pcVar1)(local_f8,0x2a,*(undefined8 *)(in_RDI + 0x9d0));
  }
  *(ulong *)(*(long *)(in_RDI + 0x9f0) + 0x90) =
       *(long *)(*(long *)(in_RDI + 0x9f0) + 0x90) - local_30;
  return;
}

Assistant:

void Parser::_save_indentation(size_t behind)
{
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_state->line_contents.rem.begin() >= m_state->line_contents.full.begin());
    m_state->indref = static_cast<size_t>(m_state->line_contents.rem.begin() - m_state->line_contents.full.begin());
    _RYML_CB_ASSERT(m_stack.m_callbacks, behind <= m_state->indref);
    m_state->indref -= behind;
    _c4dbgpf("state[{}]: saving indentation: {}", m_state-m_stack.begin(), m_state->indref);
}